

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_table.cc
# Opt level: O2

void __thiscall Table::test(Table *this)

{
  Test *pTVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  long lVar4;
  int iVar5;
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  iVar3 = 0;
  for (iVar5 = 0; iVar5 != 0x14; iVar5 = iVar5 + 2) {
    pTVar1 = ObjTable<Test>::operator[](&this->super_ObjTable<Test>,iVar3);
    pTVar1->value = iVar5;
    pTVar1 = ObjTable<Test>::operator[](&this->super_ObjTable<Test>,iVar3 + 1000);
    pTVar1->value = iVar5 + 2000;
    iVar3 = iVar3 + 1;
  }
  for (lVar4 = 0; lVar4 != 0x30; lVar4 = lVar4 + 4) {
    iVar3 = *(int *)((long)&DAT_0020c0ec + lVar4);
    pTVar1 = ObjTable<Test>::operator[](&this->super_ObjTable<Test>,iVar3);
    pTVar1->value = iVar3 * 2;
  }
  ObjTable<Test>::resize(&this->super_ObjTable<Test>,100);
  for (lVar4 = 0; lVar4 != 0x28; lVar4 = lVar4 + 4) {
    iVar3 = *(int *)((long)&DAT_0020c11c + lVar4);
    pTVar1 = ObjTable<Test>::operator[](&this->super_ObjTable<Test>,iVar3);
    pTVar1->value = iVar3 * 3;
  }
  ObjTable<Test>::resize(&this->super_ObjTable<Test>,200);
  for (local_68._M_dataplus._M_p._0_4_ = 1; (int)local_68._M_dataplus._M_p < 10;
      local_68._M_dataplus._M_p._0_4_ = (int)local_68._M_dataplus._M_p + 1) {
    ObjTable<Test>::emplace_back<int&>(&this->super_ObjTable<Test>,(int *)&local_68);
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(int,_const_Test_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/obj_table.cc:41:17)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(int,_const_Test_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/obj_table.cc:41:17)>
             ::_M_manager;
  ObjTable<Test>::forEach
            (&this->super_ObjTable<Test>,(function<void_(int,_const_Test_&)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  poVar2 = std::operator<<((ostream *)&std::cout,"2000 : ");
  pTVar1 = ObjTable<Test>::element(&this->super_ObjTable<Test>,2000);
  std::__cxx11::to_string(&local_68,pTVar1->value);
  poVar2 = std::operator<<(poVar2,(string *)&local_68);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void
    test()
    {
        for (int i = 0; i < 10; ++i) {
            (*this)[i].value = 2 * i;
            (*this)[1000 + i].value = 2 * (1000 + i);
        }
        for (int i: {50, 60, 70, 98, 99, 100, 101, 150, 198, 199, 200, 201}) {
            (*this)[i].value = 2 * i;
        }
        resize(100);
        for (int i: {1, 99, 100, 105, 110, 120, 205, 206, 207, 210}) {
            (*this)[i].value = 3 * i;
        }
        resize(200);

        for (int i = 1; i < 10; ++i) {
            emplace_back(i);
        }

        forEach([](auto i, auto const& item) -> void {
            if (item.value) {
                std::cout << std::to_string(i) << " : " << std::to_string(item.value) << "\n";
            }
        });

        std::cout << "2000 : " << std::to_string((*this)[2000].value) << "\n";
    }